

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
fasttext::Model::findKBest
          (Model *this,int32_t k,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  pointer *pppVar1;
  float fVar2;
  int iVar3;
  iterator __position;
  pointer ppVar4;
  pointer ppVar5;
  bool bVar6;
  pair<float,_int> in_RAX;
  real *prVar7;
  undefined4 extraout_var;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long i;
  double dVar12;
  pair<float,_int> local_38;
  
  local_38 = in_RAX;
  computeOutputSoftmax(this,hidden,output);
  if (0 < this->osz_) {
    i = 0;
    do {
      if ((long)(heap->
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(heap->
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3 == (long)k) {
        prVar7 = Vector::operator[](output,i);
        dVar12 = utils::log((double)(ulong)(uint)*prVar7);
        if (((heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start)->first <= SUB84(dVar12,0)) goto LAB_00114e1a;
      }
      else {
LAB_00114e1a:
        prVar7 = Vector::operator[](output,i);
        dVar12 = utils::log((double)(ulong)(uint)*prVar7);
        local_38 = (pair<float,_int>)(CONCAT44(extraout_var,SUB84(dVar12,0)) | i << 0x20);
        __position._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (heap->
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
          _M_realloc_insert<std::pair<float,int>>
                    ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,
                     __position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppVar1 = &(heap->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
        ppVar4 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        fVar2 = ppVar4[-1].first;
        ppVar5 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar3 = ppVar4[-1].second;
        uVar8 = (long)ppVar4 - (long)ppVar5 >> 3;
        lVar9 = uVar8 - 1;
        if (1 < (long)uVar8) {
          do {
            lVar10 = (lVar9 - (lVar9 + -1 >> 0x3f)) + -1 >> 1;
            if (ppVar5[lVar10].first <= fVar2) break;
            ppVar5[lVar9].first = ppVar5[lVar10].first;
            ppVar5[lVar9].second = ppVar5[lVar10].second;
            bVar6 = 2 < lVar9;
            lVar9 = lVar10;
          } while (bVar6);
        }
        ppVar5[lVar9].first = fVar2;
        ppVar5[lVar9].second = iVar3;
        if ((ulong)(long)k < uVar8) {
          if (8 < (long)ppVar4 - (long)ppVar5) {
            fVar2 = ppVar4[-1].first;
            iVar3 = ppVar4[-1].second;
            ppVar4[-1].first = ppVar5->first;
            ppVar4[-1].second = ppVar5->second;
            uVar8 = (long)(ppVar4 + -1) - (long)ppVar5;
            lVar9 = (long)uVar8 >> 3;
            if (lVar9 < 3) {
              lVar10 = 0;
            }
            else {
              lVar11 = 0;
              do {
                if (ppVar5[lVar11 * 2 + 1].first < ppVar5[lVar11 * 2 + 2].first) {
                  lVar10 = lVar11 * 2 + 1;
                }
                else {
                  lVar10 = lVar11 * 2 + 2;
                }
                ppVar5[lVar11].first = ppVar5[lVar10].first;
                ppVar5[lVar11].second = ppVar5[lVar10].second;
                lVar11 = lVar10;
              } while (lVar10 < (lVar9 - (lVar9 + -1 >> 0x3f)) + -1 >> 1);
            }
            if (((uVar8 & 8) == 0) && (lVar10 == lVar9 + -2 >> 1)) {
              ppVar5[lVar10].first = ppVar5[lVar10 * 2 + 1].first;
              ppVar5[lVar10].second = ppVar5[lVar10 * 2 + 1].second;
              lVar10 = lVar10 * 2 + 1;
            }
            if (0 < lVar10) {
              do {
                lVar9 = (lVar10 - (lVar10 + -1 >> 0x3f)) + -1 >> 1;
                if (ppVar5[lVar9].first <= fVar2) break;
                ppVar5[lVar10].first = ppVar5[lVar9].first;
                ppVar5[lVar10].second = ppVar5[lVar9].second;
                bVar6 = 2 < lVar10;
                lVar10 = lVar9;
              } while (bVar6);
            }
            ppVar5[lVar10].first = fVar2;
            ppVar5[lVar10].second = iVar3;
          }
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar4 + -1;
        }
      }
      i = i + 1;
    } while (i < this->osz_);
  }
  return;
}

Assistant:

void Model::findKBest(int32_t k, std::vector<std::pair<real, int32_t>>& heap,
                      Vector& hidden, Vector& output) const {
  computeOutputSoftmax(hidden, output);
  for (int32_t i = 0; i < osz_; i++) {
    if (heap.size() == k && utils::log(output[i]) < heap.front().first) {
      continue;
    }
    heap.push_back(std::make_pair(utils::log(output[i]), i));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}